

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssignToMatrixSwizzle
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TIntermediate *pTVar1;
  int iVar2;
  TBasicType t;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  TIntermTyped *base;
  undefined4 extraout_var_02;
  long lVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar6;
  TVariable *variable;
  TIntermAggregate *left_00;
  undefined4 extraout_var_05;
  TIntermConstantUnion *pTVar7;
  TIntermTyped *pTVar8;
  long lVar9;
  TIntermTyped *pTVar10;
  long lVar11;
  TIntermSymbol *local_220;
  TType columnType;
  TType indexType;
  TType componentType;
  
  iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left);
    if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 0xb8) == 0x2d7) {
      if (op != EOpAssign) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"only simple assignment to non-simple matrix swizzle is supported",
                   "assign");
      }
      iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
      plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))
                                 ((long *)CONCAT44(extraout_var_01,iVar2));
      base = (TIntermTyped *)(**(code **)(*plVar4 + 0x18))(plVar4);
      iVar2 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
      plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x198))
                                 ((long *)CONCAT44(extraout_var_02,iVar2));
      plVar4 = (long *)(**(code **)(*plVar4 + 0x30))(plVar4);
      lVar5 = (**(code **)(*plVar4 + 400))(plVar4);
      iVar2 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])(right);
      local_220 = (TIntermSymbol *)CONCAT44(extraout_var_03,iVar2);
      iVar2 = 0;
      if (local_220 == (TIntermSymbol *)0x0) {
        t = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
        iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
        uVar6 = (ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3;
        TType::TType(&columnType,t,EvqTemporary,
                     *(uint *)(CONCAT44(extraout_var_04,iVar3) + 8) >> 0x19 & 7,
                     (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                          2),0,0,false);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        variable = makeInternalVariable(this,"intermVec",&columnType);
        local_220 = TIntermediate::addSymbol(pTVar1,variable,loc);
        pTVar8 = handleAssign(this,loc,op,&local_220->super_TIntermTyped,right);
      }
      else {
        pTVar8 = (TIntermTyped *)0x0;
      }
      left_00 = TIntermediate::makeAggregate
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           &pTVar8->super_TIntermNode);
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      TType::TType(&columnType,(TType *)CONCAT44(extraout_var_05,iVar3),0,false);
      TType::TType(&componentType,&columnType,0,false);
      TType::TType(&indexType,EbtInt,EvqTemporary,1,0,0,false);
      for (lVar11 = 0; lVar11 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3);
          lVar11 = lVar11 + 2) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar7 = TIntermediate::addConstantUnion(pTVar1,iVar2,loc,false);
        pTVar8 = TIntermediate::addIndex
                           (pTVar1,EOpIndexDirect,&local_220->super_TIntermTyped,
                            &pTVar7->super_TIntermTyped,loc);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        lVar9 = (**(code **)(**(long **)(*(long *)(lVar5 + 8) + lVar11 * 8) + 0x28))();
        pTVar7 = TIntermediate::addConstantUnion
                           (pTVar1,(TConstUnionArray *)(lVar9 + 0xb8),&indexType,loc,false);
        pTVar10 = TIntermediate::addIndex
                            (pTVar1,EOpIndexDirect,base,&pTVar7->super_TIntermTyped,loc);
        (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar10,&columnType);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        lVar9 = (**(code **)(**(long **)(*(long *)(lVar5 + 8) + 8 + lVar11 * 8) + 0x28))();
        pTVar7 = TIntermediate::addConstantUnion
                           (pTVar1,(TConstUnionArray *)(lVar9 + 0xb8),&indexType,loc,false);
        pTVar10 = TIntermediate::addIndex
                            (pTVar1,EOpIndexDirect,pTVar10,&pTVar7->super_TIntermTyped,loc);
        (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar10,&componentType);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar8 = TIntermediate::addAssign(pTVar1,op,pTVar10,pTVar8,loc);
        left_00 = TIntermediate::growAggregate
                            (pTVar1,(TIntermNode *)left_00,&pTVar8->super_TIntermNode);
        iVar2 = iVar2 + 1;
      }
      (left_00->super_TIntermOperator).op = EOpSequence;
      return (TIntermTyped *)left_00;
    }
  }
  __assert_fail("left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0xca4,
                "TIntermTyped *glslang::HlslParseContext::handleAssignToMatrixSwizzle(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
               );
}

Assistant:

TIntermTyped* HlslParseContext::handleAssignToMatrixSwizzle(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                                            TIntermTyped* right)
{
    assert(left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle);

    if (op != EOpAssign)
        error(loc, "only simple assignment to non-simple matrix swizzle is supported", "assign", "");

    // isolate the matrix and swizzle nodes
    TIntermTyped* matrix = left->getAsBinaryNode()->getLeft()->getAsTyped();
    const TIntermSequence& swizzle = left->getAsBinaryNode()->getRight()->getAsAggregate()->getSequence();

    // if the RHS isn't already a simple vector, let's store into one
    TIntermSymbol* vector = right->getAsSymbolNode();
    TIntermTyped* vectorAssign = nullptr;
    if (vector == nullptr) {
        // create a new intermediate vector variable to assign to
        TType vectorType(matrix->getBasicType(), EvqTemporary, matrix->getQualifier().precision, (int)swizzle.size()/2);
        vector = intermediate.addSymbol(*makeInternalVariable("intermVec", vectorType), loc);

        // assign the right to the new vector
        vectorAssign = handleAssign(loc, op, vector, right);
    }

    // Assign the vector components to the matrix components.
    // Store this as a sequence, so a single aggregate node represents this
    // entire operation.
    TIntermAggregate* result = intermediate.makeAggregate(vectorAssign);
    TType columnType(matrix->getType(), 0);
    TType componentType(columnType, 0);
    TType indexType(EbtInt);
    for (int i = 0; i < (int)swizzle.size(); i += 2) {
        // the right component, single index into the RHS vector
        TIntermTyped* rightComp = intermediate.addIndex(EOpIndexDirect, vector,
                                    intermediate.addConstantUnion(i/2, loc), loc);

        // the left component, double index into the LHS matrix
        TIntermTyped* leftComp = intermediate.addIndex(EOpIndexDirect, matrix,
                                    intermediate.addConstantUnion(swizzle[i]->getAsConstantUnion()->getConstArray(),
                                                                  indexType, loc),
                                    loc);
        leftComp->setType(columnType);
        leftComp = intermediate.addIndex(EOpIndexDirect, leftComp,
                                    intermediate.addConstantUnion(swizzle[i+1]->getAsConstantUnion()->getConstArray(),
                                                                  indexType, loc),
                                    loc);
        leftComp->setType(componentType);

        // Add the assignment to the aggregate
        result = intermediate.growAggregate(result, intermediate.addAssign(op, leftComp, rightComp, loc));
    }

    result->setOp(EOpSequence);

    return result;
}